

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ConstantDerivateCase::verify
          (ConstantDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Vec4 *scale;
  float fVar1;
  int i;
  bool bVar2;
  undefined7 extraout_var;
  long lVar3;
  float fVar4;
  float local_58 [4];
  Vec4 threshold;
  Vec4 reference;
  
  reference.m_data[0] = 0.0;
  reference.m_data[1] = 0.0;
  reference.m_data[2] = 0.0;
  reference.m_data[3] = 0.0;
  TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)&stack0xffffffffffffffd8);
  scale = &(this->super_TriangleDerivateCase).m_derivScale;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar3 = 0;
  do {
    fVar1 = scale->m_data[lVar3];
    fVar4 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar4 = fVar1;
    }
    local_58[lVar3] = fVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  threshold.m_data[0] = 0.0;
  threshold.m_data[1] = 0.0;
  threshold.m_data[2] = 0.0;
  threshold.m_data[3] = 0.0;
  lVar3 = 0;
  do {
    threshold.m_data[lVar3] = *(float *)(&stack0xffffffffffffffd8 + lVar3 * 4) / local_58[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  bVar2 = verifyConstantDerivate
                    (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,
                     (PixelBufferAccess *)sig,(this->super_TriangleDerivateCase).m_dataType,
                     &reference,&threshold,scale,&(this->super_TriangleDerivateCase).m_derivBias,
                     LOG_ALL);
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

bool ConstantDerivateCase::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4 reference	(0.0f); // Derivate of constant argument should always be 0
	const tcu::Vec4	threshold	= getSurfaceThreshold() / abs(m_derivScale);

	return verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
								  reference, threshold, m_derivScale, m_derivBias);
}